

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.cpp
# Opt level: O2

GdlRuleItem * __thiscall
GdlRule::LhsSelectorItemAt
          (GdlRule *this,GrpLineAndFile *lnf,int irit,string *staClassOrAt,string *param_4,
          string *staAlias)

{
  bool bVar1;
  GdlRuleItem *pGVar2;
  string *this_00;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"Cannot specify a selector in the lhs",&local_c9)
  ;
  GrcErrorList::AddError(&g_errorList,0xc4b,&this->super_GdlObject,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = std::operator==(staClassOrAt,"@");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_68,"_",&local_c9);
    std::__cxx11::string::string((string *)&local_88,(string *)staAlias);
    pGVar2 = LhsItemAt(this,lnf,irit,&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    this_00 = &local_68;
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,(string *)staClassOrAt);
    std::__cxx11::string::string((string *)&local_c8,(string *)staAlias);
    pGVar2 = LhsItemAt(this,lnf,irit,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    this_00 = &local_a8;
  }
  std::__cxx11::string::~string((string *)this_00);
  return pGVar2;
}

Assistant:

GdlRuleItem * GdlRule::LhsSelectorItemAt(GrpLineAndFile & lnf, int irit,
	std::string staClassOrAt, std::string /*staSel*/, std::string staAlias)
{
	g_errorList.AddError(3147, this,
		"Cannot specify a selector in the lhs");

	if (staClassOrAt == "@")
		return LhsItemAt(lnf, irit, "_", staAlias);
	else
		return LhsItemAt(lnf, irit, staClassOrAt, staAlias);
}